

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O0

double * doubleCalloc(size_t n)

{
  double *pdVar1;
  char local_128 [8];
  char msg [256];
  double zero;
  size_t i;
  double *buf;
  size_t n_local;
  
  msg[0xf8] = '\0';
  msg[0xf9] = '\0';
  msg[0xfa] = '\0';
  msg[0xfb] = '\0';
  msg[0xfc] = '\0';
  msg[0xfd] = '\0';
  msg[0xfe] = '\0';
  msg[0xff] = '\0';
  pdVar1 = (double *)superlu_malloc(n << 3);
  if (pdVar1 == (double *)0x0) {
    sprintf(local_128,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in doubleCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dmemory.c");
    superlu_abort_and_exit(local_128);
  }
  for (zero = 0.0; (ulong)zero < n; zero = (double)((long)zero + 1)) {
    pdVar1[(long)zero] = (double)msg._248_8_;
  }
  return pdVar1;
}

Assistant:

double *doubleCalloc(size_t n)
{
    double *buf;
    register size_t i;
    double zero = 0.0;
    buf = (double *) SUPERLU_MALLOC(n * (size_t) sizeof(double));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in doubleCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}